

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O3

void MAFSA_automaton_search_enumerate
               (MAFSA_automaton ma,MAFSA_letter *l,size_t sz_l,MAFSA_letter *tmp,size_t sz_tmp,
               void *user_data,MAFSA_letter delim,MAFSA_automaton_string_handler fetcher)

{
  ulong uVar1;
  MAFSA_letter MVar2;
  uint uVar3;
  ulong uVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t uVar10;
  uint uVar11;
  MAFSA_stack_struct tmp_stack;
  MAFSA_stack_struct local_68;
  MAFSA_letter *local_50;
  size_t local_48;
  void *local_40;
  MAFSA_letter *local_38;
  
  if (sz_l != 0) {
    uVar8 = 0;
    local_50 = tmp;
    local_48 = sz_tmp;
    local_40 = user_data;
    local_38 = l;
    do {
      puVar6 = ma->ptr_nodes;
      uVar10 = *puVar6;
      local_68.current = 0xffffffffffffffff;
      if ((uVar8 & 0xffffffff) <= sz_l) {
        puVar5 = ma->ptr_links;
        uVar4 = 0xffffffffffffffff;
        uVar9 = uVar8 & 0xffffffff;
        local_68.buffer = tmp;
        local_68.reserved = sz_tmp;
        do {
          uVar11 = uVar10 & 0x7fffffff;
          uVar3 = puVar5[uVar11];
          uVar7 = uVar11;
          while (uVar3 != 0xff000000) {
            uVar7 = uVar7 + 1;
            if ((MAFSA_letter)(uVar3 >> 0x18) == delim) {
              if ((uVar3 & 0xffffff) != 0) {
                uVar4 = uVar4 + 1;
                if (uVar4 < local_68.reserved) {
                  local_68.buffer[uVar4] = delim;
                  puVar6 = ma->ptr_nodes;
                  local_68.current = uVar4;
                }
                enumerate(ma,puVar6[uVar3 & 0xffffff],&local_68,fetcher,local_40);
                uVar4 = local_68.current;
                tmp = local_50;
                sz_tmp = local_48;
                if (-1 < local_68.current) {
                  uVar4 = local_68.current - 1;
                  local_68.current = uVar4;
                }
              }
              break;
            }
            uVar3 = puVar5[uVar7];
          }
          MVar2 = local_38[uVar9];
          uVar1 = uVar4 + 1;
          if (uVar1 < local_68.reserved) {
            local_68.buffer[uVar1] = MVar2;
            uVar4 = uVar1;
            local_68.current = uVar1;
          }
          puVar5 = ma->ptr_links;
          uVar10 = puVar5[uVar11];
          if (uVar10 == 0xff000000) break;
          uVar9 = (ulong)((int)uVar9 + 1);
          while (uVar11 = uVar11 + 1, MVar2 != (MAFSA_letter)(uVar10 >> 0x18)) {
            uVar10 = puVar5[uVar11];
            if (uVar10 == 0xff000000) goto LAB_00106a60;
          }
          if ((uVar10 & 0xffffff) == 0) break;
          puVar6 = ma->ptr_nodes;
          uVar10 = puVar6[uVar10 & 0xffffff];
          if (sz_l < uVar9) break;
        } while( true );
      }
LAB_00106a60:
      uVar8 = uVar8 + 1;
    } while (uVar8 != sz_l);
  }
  return;
}

Assistant:

extern void MAFSA_automaton_search_enumerate(MAFSA_automaton ma, const MAFSA_letter *l, size_t sz_l, MAFSA_letter *tmp,
    size_t sz_tmp, void *user_data, MAFSA_letter delim, MAFSA_automaton_string_handler fetcher)
{
    ssize_t cur_pos;

    for (cur_pos = 0; cur_pos < sz_l; ++cur_pos)
    {
        uint32_t i = cur_pos;
        uint32_t current = ma->ptr_nodes[0];
        uint32_t where = 0;

        struct MAFSA_stack_struct tmp_stack;

        tmp_stack.buffer   = tmp;
        tmp_stack.reserved = sz_tmp;
        tmp_stack.current  = -1;

        while (i <= sz_l)
        {
            MAFSA_letter label;

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, delim)))
            {
                stack_push(&tmp_stack, delim);
                enumerate(ma, ma->ptr_nodes[where], &tmp_stack, fetcher, user_data);
                stack_pop(&tmp_stack);
            }

            label = l[i++];
            stack_push(&tmp_stack, label);

            if (0 != (where = MAFSA_delta(ma->ptr_links, current, label)))
            {
                current = ma->ptr_nodes[where];
            }
            else
            {
                break;
            }
        }
    }
}